

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>
fmt::v8::detail::write_exponent<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
          (int exp,back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> it)

{
  char cVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  wchar_t *pwVar5;
  ulong uVar6;
  uint uVar7;
  
  if (exp + 9999U < 19999) {
    sVar2 = (it.container)->size_;
    uVar3 = sVar2 + 1;
    if (exp < 0) {
      if ((it.container)->capacity_ < uVar3) {
        (**(it.container)->_vptr_buffer)(it.container);
        sVar2 = (it.container)->size_;
        uVar3 = sVar2 + 1;
      }
      pwVar5 = (it.container)->ptr_;
      (it.container)->size_ = uVar3;
      pwVar5[sVar2] = L'-';
      exp = -exp;
    }
    else {
      if ((it.container)->capacity_ < uVar3) {
        (**(it.container)->_vptr_buffer)(it.container);
        sVar2 = (it.container)->size_;
        uVar3 = sVar2 + 1;
      }
      pwVar5 = (it.container)->ptr_;
      (it.container)->size_ = uVar3;
      pwVar5[sVar2] = L'+';
    }
    if (99 < (uint)exp) {
      uVar7 = (exp & 0xffffU) / 100;
      uVar6 = (ulong)(uVar7 * 2);
      uVar4 = uVar3;
      if (999 < (uint)exp) {
        cVar1 = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                [uVar6];
        uVar4 = uVar3 + 1;
        if ((it.container)->capacity_ < uVar4) {
          (**(it.container)->_vptr_buffer)(it.container,uVar4);
          pwVar5 = (it.container)->ptr_;
          uVar3 = (it.container)->size_;
          uVar4 = uVar3 + 1;
        }
        (it.container)->size_ = uVar4;
        pwVar5[uVar3] = (int)cVar1;
      }
      cVar1 = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              [uVar6 + 1];
      uVar3 = uVar4 + 1;
      if ((it.container)->capacity_ < uVar3) {
        (**(it.container)->_vptr_buffer)(it.container,uVar3);
        pwVar5 = (it.container)->ptr_;
        uVar4 = (it.container)->size_;
        uVar3 = uVar4 + 1;
      }
      (it.container)->size_ = uVar3;
      pwVar5[uVar4] = (int)cVar1;
      exp = exp + uVar7 * -100 & 0xffff;
    }
    cVar1 = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            [(ulong)(uint)exp * 2];
    uVar4 = uVar3 + 1;
    uVar6 = (it.container)->capacity_;
    if (uVar6 < uVar4) {
      (**(it.container)->_vptr_buffer)(it.container,uVar4);
      pwVar5 = (it.container)->ptr_;
      uVar3 = (it.container)->size_;
      uVar4 = uVar3 + 1;
      uVar6 = (it.container)->capacity_;
    }
    (it.container)->size_ = uVar4;
    pwVar5[uVar3] = (int)cVar1;
    cVar1 = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            [(ulong)(uint)exp * 2 + 1];
    uVar3 = uVar4 + 1;
    if (uVar6 < uVar3) {
      (**(it.container)->_vptr_buffer)(it.container);
      uVar4 = (it.container)->size_;
      uVar3 = uVar4 + 1;
    }
    (it.container)->size_ = uVar3;
    (it.container)->ptr_[uVar4] = (int)cVar1;
    return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)it.container;
  }
  fmt::v8::detail::assert_fail
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h"
             ,0x508,"exponent out of range");
}

Assistant:

FMT_CONSTEXPR auto write_exponent(int exp, It it) -> It {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = digits2(to_unsigned(exp / 100));
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = digits2(to_unsigned(exp));
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}